

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O0

FT_Error T1_Set_MM_Design(T1_Face face,FT_UInt num_coords,FT_Long *coords)

{
  PS_Blend pPVar1;
  long *plVar2;
  FT_Fixed *pFVar3;
  PS_DesignMapRec *pPVar4;
  FT_Long p_design;
  FT_Int after;
  FT_Int before;
  FT_Fixed *blends;
  FT_Long *designs;
  PS_DesignMap map;
  FT_Fixed the_blend;
  FT_Long design;
  FT_Fixed final_blends [16];
  uint local_40;
  uint local_3c;
  FT_UInt p;
  FT_UInt n;
  PS_Blend blend;
  FT_Error error;
  FT_Long *coords_local;
  FT_UInt num_coords_local;
  T1_Face face_local;
  
  pPVar1 = face->blend;
  if (pPVar1 == (PS_Blend)0x0) {
    face_local._4_4_ = 6;
  }
  else {
    coords_local._4_4_ = num_coords;
    if (pPVar1->num_axis < num_coords) {
      coords_local._4_4_ = pPVar1->num_axis;
    }
    for (local_3c = 0; local_3c < pPVar1->num_axis; local_3c = local_3c + 1) {
      pPVar4 = pPVar1->design_map + local_3c;
      plVar2 = pPVar4->design_points;
      pFVar3 = pPVar4->blend_points;
      p_design._4_4_ = 0xffffffff;
      p_design._0_4_ = 0xffffffff;
      if (local_3c < coords_local._4_4_) {
        the_blend = coords[local_3c];
      }
      else {
        the_blend = (plVar2[(int)(pPVar4->num_points - 1)] - *plVar2) / 2;
      }
      for (local_40 = 0; local_40 < pPVar4->num_points; local_40 = local_40 + 1) {
        if (the_blend == plVar2[local_40]) {
          map = (PS_DesignMap)pFVar3[local_40];
          goto LAB_0034b5ed;
        }
        if (the_blend < plVar2[local_40]) {
          p_design._0_4_ = local_40;
          break;
        }
        p_design._4_4_ = local_40;
      }
      if ((int)p_design._4_4_ < 0) {
        map = (PS_DesignMap)*pFVar3;
      }
      else if ((int)(uint)p_design < 0) {
        map = (PS_DesignMap)pFVar3[(int)(pPVar4->num_points - 1)];
      }
      else {
        map = (PS_DesignMap)
              FT_MulDiv(the_blend - plVar2[(int)p_design._4_4_],
                        pFVar3[(int)(uint)p_design] - pFVar3[(int)p_design._4_4_],
                        plVar2[(int)(uint)p_design] - plVar2[(int)p_design._4_4_]);
      }
LAB_0034b5ed:
      final_blends[(ulong)local_3c - 1] = (FT_Fixed)map;
    }
    face_local._4_4_ = t1_set_mm_blend(face,pPVar1->num_axis,&design);
    if (face_local._4_4_ == 0) {
      if (coords_local._4_4_ == 0) {
        (face->root).face_flags = (face->root).face_flags & 0xffffffffffff7fff;
      }
      else {
        (face->root).face_flags = (face->root).face_flags | 0x8000;
      }
      face_local._4_4_ = 0;
    }
  }
  return face_local._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T1_Set_MM_Design( T1_Face   face,
                    FT_UInt   num_coords,
                    FT_Long*  coords )
  {
    FT_Error  error;
    PS_Blend  blend = face->blend;
    FT_UInt   n, p;
    FT_Fixed  final_blends[T1_MAX_MM_DESIGNS];


    if ( !blend )
      return FT_THROW( Invalid_Argument );

    if ( num_coords > blend->num_axis )
      num_coords = blend->num_axis;

    /* compute the blend coordinates through the blend design map */

    for ( n = 0; n < blend->num_axis; n++ )
    {
      FT_Long       design;
      FT_Fixed      the_blend;
      PS_DesignMap  map     = blend->design_map + n;
      FT_Long*      designs = map->design_points;
      FT_Fixed*     blends  = map->blend_points;
      FT_Int        before  = -1, after = -1;


      /* use a default value if we don't have a coordinate */
      if ( n < num_coords )
        design = coords[n];
      else
        design = ( designs[map->num_points - 1] - designs[0] ) / 2;

      for ( p = 0; p < (FT_UInt)map->num_points; p++ )
      {
        FT_Long  p_design = designs[p];


        /* exact match? */
        if ( design == p_design )
        {
          the_blend = blends[p];
          goto Found;
        }

        if ( design < p_design )
        {
          after = (FT_Int)p;
          break;
        }

        before = (FT_Int)p;
      }

      /* now interpolate if necessary */
      if ( before < 0 )
        the_blend = blends[0];

      else if ( after < 0 )
        the_blend = blends[map->num_points - 1];

      else
        the_blend = FT_MulDiv( design         - designs[before],
                               blends [after] - blends [before],
                               designs[after] - designs[before] );

    Found:
      final_blends[n] = the_blend;
    }

    error = t1_set_mm_blend( face, blend->num_axis, final_blends );
    if ( error )
      return error;

    if ( num_coords )
      face->root.face_flags |= FT_FACE_FLAG_VARIATION;
    else
      face->root.face_flags &= ~FT_FACE_FLAG_VARIATION;

    return FT_Err_Ok;
  }